

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
RPCHelpMan::MaybeArg<std::__cxx11::string>(RPCHelpMan *this,string_view key)

{
  long lVar1;
  size_t i;
  string *psVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  i = GetParamIndex(this,key);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    psVar2 = ArgValue<std::__cxx11::string_const*>(this,i);
    return psVar2;
  }
  __stack_chk_fail();
}

Assistant:

auto MaybeArg(std::string_view key) const
    {
        auto i{GetParamIndex(key)};
        // Return optional argument (without default).
        if constexpr (std::is_integral_v<R> || std::is_floating_point_v<R>) {
            // Return numbers by value, wrapped in optional.
            return ArgValue<std::optional<R>>(i);
        } else {
            // Return other types by pointer.
            return ArgValue<const R*>(i);
        }
    }